

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash.cpp
# Opt level: O1

bool __thiscall
NJamSpell::TPerfectHash::Init
          (TPerfectHash *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  pointer pbVar1;
  int iVar2;
  phf *phf;
  string *s;
  pointer pbVar3;
  phf_string local_58;
  undefined1 auStack_48 [8];
  vector<phf_string,_std::allocator<phf_string>_> keysForPhf;
  
  auStack_48 = (undefined1  [8])0x0;
  keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<phf_string,_std::allocator<phf_string>_>::reserve
            ((vector<phf_string,_std::allocator<phf_string>_> *)auStack_48,
             (long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar3 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (keys->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    do {
      local_58.p = (pbVar3->_M_dataplus)._M_p;
      local_58.n = pbVar3->_M_string_length;
      if (keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
          super__Vector_impl_data._M_start ==
          keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<phf_string,_std::allocator<phf_string>_>::_M_realloc_insert<phf_string>
                  ((vector<phf_string,_std::allocator<phf_string>_> *)auStack_48,
                   (iterator)
                   keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_58);
      }
      else {
        (keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
         super__Vector_impl_data._M_start)->p = local_58.p;
        (keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
         super__Vector_impl_data._M_start)->n = local_58.n;
        keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
        super__Vector_impl_data._M_start =
             keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != pbVar1);
  }
  phf = (phf *)operator_new(0x38);
  phf->d_max = 0;
  *(undefined8 *)&phf->g_op = 0;
  phf->m = 0;
  phf->g = (uint32_t *)0x0;
  phf->nodiv = false;
  *(undefined3 *)&phf->field_0x1 = 0;
  phf->seed = 0;
  phf->r = 0;
  phf->g_jmp = (void *)0x0;
  iVar2 = PHF::init<phf_string,false>
                    (phf,(phf_string *)auStack_48,
                     (long)keysForPhf.super__Vector_base<phf_string,_std::allocator<phf_string>_>.
                           _M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 4,4,0x50,
                     0x2a);
  if (iVar2 == 0) {
    Clear(this);
    this->Phf = phf;
  }
  else {
    PHF::destroy(phf);
    operator_delete(phf);
  }
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48);
  }
  return iVar2 == 0;
}

Assistant:

bool TPerfectHash::Init(const std::vector<std::string>& keys) {
    std::vector<phf_string_t> keysForPhf;
    keysForPhf.reserve(keys.size());
    for (const std::string& s: keys) {
        keysForPhf.push_back({&s[0], s.size()});
    }

    phf* tempPhf = new phf();
    phf_error_t res = PHF::init<phf_string_t, false>(tempPhf, &keysForPhf[0], keysForPhf.size(), 4, 80, 42);
    if (res != 0) {
        PHF::destroy(tempPhf);
        delete tempPhf;
        return false;
    }
    Clear();
    Phf = tempPhf;
    return true;
}